

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommand.cxx
# Opt level: O0

void __thiscall
cmCustomCommand::cmCustomCommand
          (cmCustomCommand *this,cmMakefile *mf,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *outputs,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *byproducts,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,cmCustomCommandLines *commandLines,char *comment,char *workingDirectory)

{
  char *local_d0;
  char *local_b0;
  cmListFileBacktrace local_68;
  allocator local_46;
  allocator local_45 [13];
  cmCustomCommandLines *local_38;
  cmCustomCommandLines *commandLines_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *depends_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *byproducts_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs_local;
  cmMakefile *mf_local;
  cmCustomCommand *this_local;
  
  local_38 = commandLines;
  commandLines_local = (cmCustomCommandLines *)depends;
  depends_local = byproducts;
  byproducts_local = outputs;
  outputs_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)mf;
  mf_local = (cmMakefile *)this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Outputs,outputs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Byproducts,depends_local);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Depends,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)commandLines_local);
  cmCustomCommandLines::cmCustomCommandLines(&this->CommandLines,local_38);
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace);
  ImplicitDependsList::ImplicitDependsList(&this->ImplicitDepends);
  if (comment == (char *)0x0) {
    local_b0 = "";
  }
  else {
    local_b0 = comment;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->Comment,local_b0,local_45);
  std::allocator<char>::~allocator((allocator<char> *)local_45);
  if (workingDirectory == (char *)0x0) {
    local_d0 = "";
  }
  else {
    local_d0 = workingDirectory;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->WorkingDirectory,local_d0,&local_46);
  std::allocator<char>::~allocator((allocator<char> *)&local_46);
  std::__cxx11::string::string((string *)&this->Depfile);
  this->HaveComment = comment != (char *)0x0;
  this->EscapeAllowMakeVars = false;
  this->EscapeOldStyle = true;
  this->CommandExpandLists = false;
  if (outputs_local !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    cmMakefile::GetBacktrace(&local_68,(cmMakefile *)outputs_local);
    cmListFileBacktrace::operator=(&this->Backtrace,&local_68);
    cmListFileBacktrace::~cmListFileBacktrace(&local_68);
  }
  return;
}

Assistant:

cmCustomCommand::cmCustomCommand(cmMakefile const* mf,
                                 const std::vector<std::string>& outputs,
                                 const std::vector<std::string>& byproducts,
                                 const std::vector<std::string>& depends,
                                 const cmCustomCommandLines& commandLines,
                                 const char* comment,
                                 const char* workingDirectory)
  : Outputs(outputs)
  , Byproducts(byproducts)
  , Depends(depends)
  , CommandLines(commandLines)
  , Backtrace()
  , Comment(comment ? comment : "")
  , WorkingDirectory(workingDirectory ? workingDirectory : "")
  , HaveComment(comment != CM_NULLPTR)
  , EscapeAllowMakeVars(false)
  , EscapeOldStyle(true)
  , CommandExpandLists(false)
{
  if (mf) {
    this->Backtrace = mf->GetBacktrace();
  }
}